

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O2

void __thiscall xemmai::t_script::f_scan(t_script *this,t_scan a_scan)

{
  _Elt_pointer ptVar1;
  _Elt_pointer ptVar2;
  t_slot *p;
  _Elt_pointer ptVar3;
  _Map_pointer pptVar4;
  
  std::mutex::lock(&this->v_mutex);
  ptVar3 = (this->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  ptVar2 = (this->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  pptVar4 = (this->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node;
  ptVar1 = (this->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (ptVar3 != ptVar1) {
    (*a_scan)((ptVar3->v_p)._M_b._M_p);
    ptVar3 = ptVar3 + 1;
    if (ptVar3 == ptVar2) {
      ptVar3 = pptVar4[1];
      pptVar4 = pptVar4 + 1;
      ptVar2 = ptVar3 + 0x40;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->v_mutex);
  return;
}

Assistant:

void t_script::f_scan(t_scan a_scan)
{
	std::lock_guard lock(v_mutex);
	for (auto& p : v_slots) a_scan(p);
}